

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestLogWriter.cpp
# Opt level: O2

ostream * xe::operator<<(ostream *str,Base64Formatter *fmt)

{
  int iVar1;
  deUint8 *pdVar2;
  int iVar3;
  undefined8 in_RAX;
  int iVar4;
  char cVar5;
  uint uVar6;
  byte bVar7;
  int iVar8;
  undefined8 uStack_38;
  
  pdVar2 = fmt->data;
  iVar1 = fmt->numBytes;
  uStack_38 = in_RAX;
  for (iVar8 = 0; iVar4 = iVar1 - iVar8, iVar4 != 0 && iVar8 <= iVar1; iVar8 = iVar8 + iVar3) {
    iVar3 = 3;
    if (iVar4 < 3) {
      iVar3 = iVar4;
    }
    uVar6 = 0;
    if (iVar4 < 2) {
      bVar7 = 0;
    }
    else {
      bVar7 = pdVar2[(long)iVar8 + 1];
      uVar6 = 0;
      if (iVar4 != 2) {
        uVar6 = (uint)pdVar2[iVar8 + 2];
      }
    }
    uStack_38._0_6_ =
         CONCAT15("ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                  [(uint)(bVar7 >> 4) | (pdVar2[iVar8] & 3) << 4],
                  CONCAT14("ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                           [pdVar2[iVar8] >> 2],(undefined4)uStack_38));
    uStack_38._0_7_ =
         CONCAT16("ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                  [(uVar6 >> 6) + (bVar7 & 0xf) * 4],(undefined6)uStack_38);
    cVar5 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[uVar6 & 0x3f];
    if (iVar4 < 3) {
      cVar5 = '=';
    }
    if (iVar4 < 2) {
      uStack_38._0_7_ = CONCAT16(0x3d,(undefined6)uStack_38);
    }
    uStack_38 = CONCAT17(cVar5,(undefined7)uStack_38);
    std::ostream::write((char *)str,(long)&uStack_38 + 4);
  }
  return str;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const Base64Formatter& fmt)
{
	static const char s_base64Table[64] =
	{
		'A','B','C','D','E','F','G','H','I','J','K','L','M',
		'N','O','P','Q','R','S','T','U','V','W','X','Y','Z',
		'a','b','c','d','e','f','g','h','i','j','k','l','m',
		'n','o','p','q','r','s','t','u','v','w','x','y','z',
		'0','1','2','3','4','5','6','7','8','9','+','/'
	};

	const deUint8*	data		= fmt.data;
	int				numBytes	= fmt.numBytes;
	int				srcNdx		= 0;

	DE_ASSERT(data && (numBytes > 0));

	/* Loop all input chars. */
	while (srcNdx < numBytes)
	{
		int		numRead	= de::min(3, numBytes - srcNdx);
		deUint8	s0		= data[srcNdx];
		deUint8	s1		= (numRead >= 2) ? data[srcNdx+1] : 0;
		deUint8	s2		= (numRead >= 3) ? data[srcNdx+2] : 0;
		char	d[4];

		srcNdx += numRead;

		d[0] = s_base64Table[s0 >> 2];
		d[1] = s_base64Table[((s0&0x3)<<4) | (s1>>4)];
		d[2] = s_base64Table[((s1&0xF)<<2) | (s2>>6)];
		d[3] = s_base64Table[s2&0x3F];

		if (numRead < 3) d[3] = '=';
		if (numRead < 2) d[2] = '=';

		/* Write data. */
		str.write(&d[0], sizeof(d));
	}

	return str;
}